

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_extract_constant_composite_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t result_type,SPIRConstant *c,uint32_t *chain,uint32_t length)

{
  bool bVar1;
  uint32_t id;
  SPIRType *type;
  undefined4 in_register_00000034;
  Compiler *this_00;
  undefined4 in_register_00000084;
  uint *puVar2;
  undefined4 in_R9D;
  bool local_1e9;
  SPIRType *composite_type;
  TypedID<(spirv_cross::Types)1> local_1a4;
  undefined1 local_1a0 [8];
  SPIRConstant tmp;
  uint32_t length_local;
  uint32_t *chain_local;
  SPIRConstant *c_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  puVar2 = (uint *)CONCAT44(in_register_00000084,length);
  this_00 = (Compiler *)CONCAT44(in_register_00000034,result_type);
  tmp._356_4_ = in_R9D;
  SPIRConstant::SPIRConstant((SPIRConstant *)local_1a0);
  TypedID<(spirv_cross::Types)1>::TypedID(&local_1a4,(uint32_t)c);
  tmp.super_IVariant._vptr_IVariant._4_4_ = local_1a4.id;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)(chain + 3));
  type = Compiler::get<spirv_cross::SPIRType>(this_00,id);
  local_1e9 = false;
  if (*(int *)&(type->super_IVariant).field_0xc != 0xf) {
    local_1e9 = VectorView<unsigned_int>::empty(&(type->array).super_VectorView<unsigned_int>);
  }
  if (local_1e9 != false) {
    if ((((byte)chain[0x42] ^ 0xff) & 1) == 0) {
      __assert_fail("!c.specialization",
                    "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x13d4,
                    "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                   );
    }
    bVar1 = Compiler::is_matrix(this_00,type);
    if (bVar1) {
      if (tmp._356_4_ == 2) {
        tmp.m.c[0].id[2].id = 1;
        tmp.m.id[2].id = 1;
        tmp.super_IVariant.self.id = (chain + (ulong)*puVar2 * 0xe + (ulong)puVar2[1] * 2 + 4)[0];
        tmp.super_IVariant._12_4_ = (chain + (ulong)*puVar2 * 0xe + (ulong)puVar2[1] * 2 + 4)[1];
      }
      else {
        if (tmp._356_4_ != 1) {
          __assert_fail("length == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x13e0,
                        "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                       );
        }
        tmp.m.c[0].id[2].id = type->vecsize;
        tmp.m.id[2].id = 1;
        memcpy(&tmp.super_IVariant.self,chain + (ulong)*puVar2 * 0xe + 4,0x34);
      }
    }
    else {
      if (tmp._356_4_ != 1) {
        __assert_fail("length == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                      ,0x13e8,
                      "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                     );
      }
      tmp.m.c[0].id[2].id = 1;
      tmp.m.id[2].id = 1;
      tmp.super_IVariant.self.id = (chain + (ulong)*puVar2 * 2 + 4)[0];
      tmp.super_IVariant._12_4_ = (chain + (ulong)*puVar2 * 2 + 4)[1];
    }
    constant_expression_abi_cxx11_(this,(SPIRConstant *)this_00,SUB81(local_1a0,0),false);
    SPIRConstant::~SPIRConstant((SPIRConstant *)local_1a0);
    return this;
  }
  __assert_fail("composite_type.basetype != SPIRType::Struct && composite_type.array.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0x13d3,
                "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
               );
}

Assistant:

string CompilerGLSL::to_extract_constant_composite_expression(uint32_t result_type, const SPIRConstant &c,
                                                              const uint32_t *chain, uint32_t length)
{
	// It is kinda silly if application actually enter this path since they know the constant up front.
	// It is useful here to extract the plain constant directly.
	SPIRConstant tmp;
	tmp.constant_type = result_type;
	auto &composite_type = get<SPIRType>(c.constant_type);
	assert(composite_type.basetype != SPIRType::Struct && composite_type.array.empty());
	assert(!c.specialization);

	if (is_matrix(composite_type))
	{
		if (length == 2)
		{
			tmp.m.c[0].vecsize = 1;
			tmp.m.columns = 1;
			tmp.m.c[0].r[0] = c.m.c[chain[0]].r[chain[1]];
		}
		else
		{
			assert(length == 1);
			tmp.m.c[0].vecsize = composite_type.vecsize;
			tmp.m.columns = 1;
			tmp.m.c[0] = c.m.c[chain[0]];
		}
	}
	else
	{
		assert(length == 1);
		tmp.m.c[0].vecsize = 1;
		tmp.m.columns = 1;
		tmp.m.c[0].r[0] = c.m.c[0].r[chain[0]];
	}

	return constant_expression(tmp);
}